

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

bool __thiscall Imf_2_5::InputFile::isComplete(InputFile *this)

{
  Data *pDVar1;
  bool bVar2;
  
  pDVar1 = this->_data;
  if (pDVar1->dsFile != (DeepScanLineInputFile *)0x0) {
    return pDVar1->dsFile->_data->fileIsComplete;
  }
  if (pDVar1->isTiled == true) {
    bVar2 = TiledInputFile::isComplete(pDVar1->tFile);
    return bVar2;
  }
  bVar2 = ScanLineInputFile::isComplete(pDVar1->sFile);
  return bVar2;
}

Assistant:

bool
InputFile::isComplete () const
{
    if (_data->dsFile)
        return _data->dsFile->isComplete();
    else if (_data->isTiled)
	return _data->tFile->isComplete();
    else
	return _data->sFile->isComplete();
}